

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_item(Am_Priority_List *this,Am_Priority_List_Item *item)

{
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item *pAVar2;
  Am_Priority_List_Item **ppAVar3;
  
  pAVar1 = item->prev;
  if (this->current == item) {
    this->current = pAVar1;
  }
  pAVar2 = item->next;
  ppAVar3 = &pAVar1->next;
  if (pAVar1 == (Am_Priority_List_Item *)0x0) {
    ppAVar3 = &this->head;
  }
  *ppAVar3 = pAVar2;
  ppAVar3 = &pAVar2->prev;
  if (pAVar2 == (Am_Priority_List_Item *)0x0) {
    ppAVar3 = &this->tail;
  }
  *ppAVar3 = pAVar1;
  return item;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_item(Am_Priority_List_Item *item)
{
  if (current == item) {
    current = item->prev; // go to prev so when do next on the next
                          // iteration, will do the next item in the list
  }

  if (item->prev)
    item->prev->next = item->next;
  else
    head = item->next;

  if (item->next)
    item->next->prev = item->prev;
  else
    tail = item->prev;
  return item;
}